

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError WebPMuxSetAnimationParams(WebPMux *mux,WebPMuxAnimParams *params)

{
  long in_RSI;
  long in_RDI;
  WebPData anim;
  uint8_t data [6];
  WebPMuxError err;
  WebPMux *mux_00;
  uint8_t *data_00;
  WebPMuxError local_1c;
  long local_18;
  int copy_data;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mux_00 = (WebPMux *)&stack0xffffffffffffffde;
  data_00 = (uint8_t *)0x6;
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_1c = WEBP_MUX_INVALID_ARGUMENT;
  }
  else if ((*(int *)(in_RSI + 4) < 0) || (0xffff < *(int *)(in_RSI + 4))) {
    local_1c = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    local_18 = in_RSI;
    local_1c = MuxDeleteAllNamedData(mux_00,0);
    copy_data = (int)((ulong)in_RDI >> 0x20);
    if ((local_1c == WEBP_MUX_OK) || (local_1c == WEBP_MUX_NOT_FOUND)) {
      PutLE32(data_00,(uint32_t)((ulong)mux_00 >> 0x20));
      PutLE16(&stack0xffffffffffffffe2,*(int *)(local_18 + 4));
      local_1c = MuxSet((WebPMux *)anim.size,anim.bytes._4_4_,
                        (WebPData *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        copy_data);
    }
  }
  return local_1c;
}

Assistant:

WebPMuxError WebPMuxSetAnimationParams(WebPMux* mux,
                                       const WebPMuxAnimParams* params) {
  WebPMuxError err;
  uint8_t data[ANIM_CHUNK_SIZE];
  const WebPData anim = { data, ANIM_CHUNK_SIZE };

  if (mux == NULL || params == NULL) return WEBP_MUX_INVALID_ARGUMENT;
  if (params->loop_count < 0 || params->loop_count >= MAX_LOOP_COUNT) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Delete any existing ANIM chunk(s).
  err = MuxDeleteAllNamedData(mux, kChunks[IDX_ANIM].tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  // Set the animation parameters.
  PutLE32(data, params->bgcolor);
  PutLE16(data + 4, params->loop_count);
  return MuxSet(mux, kChunks[IDX_ANIM].tag, &anim, 1);
}